

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  char **in_RCX;
  void *__buf;
  ssize_t len;
  char *local_58;
  ssize_t local_50;
  ssize_t len_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *x;
  const_iterator __end2;
  const_iterator __begin2;
  Headers *__range2;
  ssize_t write_len;
  Headers *headers_local;
  Stream *strm_local;
  
  __range2 = (Headers *)0x0;
  __end2 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(headers);
  x = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(headers);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&x);
    if (!bVar1) {
      strm_local = (Stream *)Stream::write(strm,0x1c237d,__buf,(size_t)in_RCX);
      if (-1 < (long)strm_local) {
        strm_local = (Stream *)
                     (&(__range2->_M_t)._M_impl.field_0x0 + (long)&strm_local->_vptr_Stream);
      }
      return (ssize_t)strm_local;
    }
    len_1 = (ssize_t)std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(&__end2);
    local_58 = (char *)std::__cxx11::string::c_str();
    len = std::__cxx11::string::c_str();
    in_RCX = (char **)&len;
    local_50 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_58,in_RCX);
    if (local_50 < 0) break;
    __range2 = (Headers *)(&(__range2->_M_t)._M_impl.field_0x0 + local_50);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  return local_50;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    auto len =
        strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}